

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

bool GetTypeConstructorFunctions
               (ExpressionContext *ctx,TypeBase *type,bool noArguments,
               SmallArray<FunctionData_*,_32U> *functions)

{
  FunctionData *pFVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  Node *pNVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  TypeBase *pTVar14;
  Node *pNVar15;
  ScopeData *pSVar16;
  ScopeData *pSVar17;
  FunctionData **ppFVar18;
  ScopeData *pSVar19;
  InplaceStr IVar20;
  ArrayView<FunctionData_*> functions_00;
  ArrayView<FunctionData_*> functions_01;
  ArrayView<FunctionData_*> functions_02;
  ArrayView<FunctionData_*> functions_03;
  FunctionLookupChain chain;
  FunctionLookupChain local_78;
  TypeBase *local_58;
  FunctionLookupChain local_50;
  TypeBase *local_38;
  
  local_38 = type;
  if (type == (TypeBase *)0x0) {
    local_58 = (TypeBase *)0x0;
  }
  else {
    local_58 = (TypeBase *)0x0;
    if (type->typeID == 0x16) {
      local_58 = type;
    }
    if (type->typeID == 0x18) {
      local_58 = *(TypeBase **)&type[2].typeIndex;
      uVar12 = NULLC::StringHashContinue(type->nameHash,"::");
      pTVar14 = *(TypeBase **)&type[2].typeIndex;
      if (*(TypeBase **)&type[2].typeIndex == (TypeBase *)0x0) {
        pTVar14 = type;
      }
      IVar20 = GetTypeConstructorName(pTVar14->name);
      goto LAB_00175d6f;
    }
  }
  uVar12 = NULLC::StringHashContinue(type->nameHash,"::");
  IVar20 = type->name;
LAB_00175d6f:
  uVar12 = NULLC::StringHashContinue(uVar12,IVar20.begin,IVar20.end);
  pSVar19 = (ScopeData *)&ctx->scope;
  pSVar17 = pSVar19;
  do {
    pSVar17 = pSVar17->scope;
    pSVar16 = local_78.scope;
    if (pSVar17 == (ScopeData *)0x0) goto LAB_00175e59;
    local_78.node = DirectChainedMap<IdentifierLookupResult>::first(&pSVar17->idLookupMap,uVar12);
    pNVar15 = local_78.node.node;
  } while (pNVar15 == (Node *)0x0);
  pSVar16 = local_78.scope;
  pNVar10 = *(Node **)(pNVar15 + 0x10);
  while (local_78.scope = pSVar17, pNVar10 != (Node *)0x0) {
    pFVar1 = *(FunctionData **)(pNVar15 + 0x10);
    if ((((!noArguments) || ((pFVar1->arguments).count == 0)) ||
        (((pFVar1->arguments).data)->value != (ExprBase *)0x0)) &&
       (pFVar1->scope->ownerType == local_38)) {
      ppFVar18 = functions->data;
      uVar13 = functions->count;
      uVar2 = functions->data;
      uVar3 = functions->count;
      functions_00.count = uVar3;
      functions_00.data = (FunctionData **)uVar2;
      functions_00._12_4_ = 0;
      bVar11 = ContainsSameOverload(functions_00,pFVar1);
      if (!bVar11) {
        if (uVar13 == functions->max) {
          SmallArray<FunctionData_*,_32U>::grow(functions,uVar13);
          ppFVar18 = functions->data;
        }
        if (ppFVar18 == (FunctionData **)0x0) goto LAB_00176178;
        uVar13 = functions->count;
        functions->count = uVar13 + 1;
        ppFVar18[uVar13] = pFVar1;
      }
    }
    anon_unknown.dwarf_c3752::FunctionLookupChain::next(&local_50,&local_78);
    local_78.node.node = local_50.node.node;
    local_78.node.start = local_50.node.start;
    pSVar17 = local_50.scope;
    pNVar15 = local_50.node.node;
    pSVar16 = local_50.scope;
    pNVar10 = local_50.node.node;
  }
LAB_00175e59:
  local_78.scope = pSVar16;
  pTVar14 = local_58;
  pSVar17 = local_78.scope;
  if (local_58 != (TypeBase *)0x0) {
    uVar13 = NULLC::StringHashContinue(local_58->nameHash,"::");
    IVar20 = GetTypeConstructorName(pTVar14->name);
    uVar13 = NULLC::StringHashContinue(uVar13,IVar20.begin,IVar20.end);
    pSVar16 = pSVar19;
    do {
      pSVar16 = pSVar16->scope;
      pSVar17 = local_78.scope;
      if (pSVar16 == (ScopeData *)0x0) goto LAB_00175f63;
      local_78.node = DirectChainedMap<IdentifierLookupResult>::first(&pSVar16->idLookupMap,uVar13);
      pNVar15 = local_78.node.node;
    } while (pNVar15 == (Node *)0x0);
    pSVar17 = local_78.scope;
    pNVar10 = *(Node **)(pNVar15 + 0x10);
    while (local_78.scope = pSVar16, pNVar10 != (Node *)0x0) {
      pFVar1 = *(FunctionData **)(pNVar15 + 0x10);
      if (((!noArguments) || ((pFVar1->arguments).count == 0)) ||
         (((pFVar1->arguments).data)->value != (ExprBase *)0x0)) {
        ppFVar18 = functions->data;
        uVar13 = functions->count;
        uVar4 = functions->data;
        uVar5 = functions->count;
        functions_01.count = uVar5;
        functions_01.data = (FunctionData **)uVar4;
        functions_01._12_4_ = 0;
        bVar11 = ContainsSameOverload(functions_01,pFVar1);
        if (!bVar11) {
          if (uVar13 == functions->max) {
            SmallArray<FunctionData_*,_32U>::grow(functions,uVar13);
            ppFVar18 = functions->data;
          }
          if (ppFVar18 == (FunctionData **)0x0) goto LAB_00176178;
          uVar13 = functions->count;
          functions->count = uVar13 + 1;
          ppFVar18[uVar13] = pFVar1;
        }
      }
      anon_unknown.dwarf_c3752::FunctionLookupChain::next(&local_50,&local_78);
      local_78.node.node = local_50.node.node;
      local_78.node.start = local_50.node.start;
      pSVar16 = local_50.scope;
      pNVar15 = local_50.node.node;
      pSVar17 = local_50.scope;
      pNVar10 = local_50.node.node;
    }
  }
LAB_00175f63:
  local_78.scope = pSVar17;
  uVar12 = NULLC::StringHashContinue(uVar12,"$");
  pSVar17 = pSVar19;
  do {
    pSVar17 = pSVar17->scope;
    if (pSVar17 == (ScopeData *)0x0) goto LAB_00176052;
    local_78.node = DirectChainedMap<IdentifierLookupResult>::first(&pSVar17->idLookupMap,uVar12);
    pNVar15 = local_78.node.node;
  } while (pNVar15 == (Node *)0x0);
  if (*(long *)(pNVar15 + 0x10) != 0) {
    local_78.scope = pSVar17;
    do {
      pFVar1 = *(FunctionData **)(pNVar15 + 0x10);
      if ((((!noArguments) || ((pFVar1->arguments).count == 0)) ||
          (((pFVar1->arguments).data)->value != (ExprBase *)0x0)) &&
         (pFVar1->scope->ownerType == local_38)) {
        ppFVar18 = functions->data;
        uVar12 = functions->count;
        uVar6 = functions->data;
        uVar7 = functions->count;
        functions_02.count = uVar7;
        functions_02.data = (FunctionData **)uVar6;
        functions_02._12_4_ = 0;
        bVar11 = ContainsSameOverload(functions_02,pFVar1);
        if (!bVar11) {
          if (uVar12 == functions->max) {
            SmallArray<FunctionData_*,_32U>::grow(functions,uVar12);
            ppFVar18 = functions->data;
          }
          if (ppFVar18 == (FunctionData **)0x0) goto LAB_00176178;
          uVar12 = functions->count;
          functions->count = uVar12 + 1;
          ppFVar18[uVar12] = pFVar1;
        }
      }
      anon_unknown.dwarf_c3752::FunctionLookupChain::next(&local_50,&local_78);
      local_78.scope = local_50.scope;
      local_78.node.node = local_50.node.node;
      local_78.node.start = local_50.node.start;
      pNVar15 = local_50.node.node;
    } while (local_50.node.node != (Node *)0x0);
  }
LAB_00176052:
  pTVar14 = local_58;
  if (local_58 != (TypeBase *)0x0) {
    uVar12 = NULLC::StringHashContinue(local_58->nameHash,"::");
    IVar20 = GetTypeConstructorName(pTVar14->name);
    uVar12 = NULLC::StringHashContinue(uVar12,IVar20.begin,IVar20.end);
    uVar12 = NULLC::StringHashContinue(uVar12,"$");
    do {
      pSVar19 = pSVar19->scope;
      if (pSVar19 == (ScopeData *)0x0) goto LAB_00176162;
      local_78.node = DirectChainedMap<IdentifierLookupResult>::first(&pSVar19->idLookupMap,uVar12);
      pNVar15 = local_78.node.node;
    } while (pNVar15 == (Node *)0x0);
    if (*(long *)(pNVar15 + 0x10) != 0) {
      local_78.scope = pSVar19;
      do {
        pFVar1 = *(FunctionData **)(pNVar15 + 0x10);
        if (((!noArguments) || ((pFVar1->arguments).count == 0)) ||
           (((pFVar1->arguments).data)->value != (ExprBase *)0x0)) {
          ppFVar18 = functions->data;
          uVar12 = functions->count;
          uVar8 = functions->data;
          uVar9 = functions->count;
          functions_03.count = uVar9;
          functions_03.data = (FunctionData **)uVar8;
          functions_03._12_4_ = 0;
          bVar11 = ContainsSameOverload(functions_03,pFVar1);
          if (!bVar11) {
            if (uVar12 == functions->max) {
              SmallArray<FunctionData_*,_32U>::grow(functions,uVar12);
              ppFVar18 = functions->data;
            }
            if (ppFVar18 == (FunctionData **)0x0) {
LAB_00176178:
              __assert_fail("data",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x162,
                            "void SmallArray<FunctionData *, 32>::push_back(const T &) [T = FunctionData *, N = 32]"
                           );
            }
            uVar12 = functions->count;
            functions->count = uVar12 + 1;
            ppFVar18[uVar12] = pFVar1;
          }
        }
        anon_unknown.dwarf_c3752::FunctionLookupChain::next(&local_50,&local_78);
        local_78.scope = local_50.scope;
        local_78.node.node = local_50.node.node;
        local_78.node.start = local_50.node.start;
        pNVar15 = local_50.node.node;
      } while (local_50.node.node != (Node *)0x0);
    }
  }
LAB_00176162:
  return functions->count != 0;
}

Assistant:

bool GetTypeConstructorFunctions(ExpressionContext &ctx, TypeBase *type, bool noArguments, SmallArray<FunctionData*, 32> &functions)
{
	TypeClass *classType = getType<TypeClass>(type);
	TypeGenericClassProto *typeGenericClassProto = getType<TypeGenericClassProto>(type);

	if(classType && classType->proto)
		typeGenericClassProto = classType->proto;

	unsigned hash = NULLC::StringHashContinue(type->nameHash, "::");

	if(classType)
	{
		InplaceStr functionName = GetTypeConstructorName(classType);

		hash = NULLC::StringHashContinue(hash, functionName.begin, functionName.end);
	}
	else
	{
		hash = NULLC::StringHashContinue(hash, type->name.begin, type->name.end);
	}

	for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, hash); chain; chain = chain.next())
	{
		if(noArguments && !chain->arguments.empty() && !chain->arguments[0].value)
			continue;

		if(chain->scope->ownerType != type)
			continue;

		if(!ContainsSameOverload(functions, *chain))
			functions.push_back(*chain);
	}

	if(typeGenericClassProto)
	{
		// Look for a member function in a generic class base and instantiate them
		unsigned hash = NULLC::StringHashContinue(typeGenericClassProto->nameHash, "::");

		InplaceStr functionName = GetTypeConstructorName(typeGenericClassProto);

		hash = NULLC::StringHashContinue(hash, functionName.begin, functionName.end);

		for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, hash); chain; chain = chain.next())
		{
			if(noArguments && !chain->arguments.empty() && !chain->arguments[0].value)
				continue;

			if(!ContainsSameOverload(functions, *chain))
				functions.push_back(*chain);
		}
	}

	for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, NULLC::StringHashContinue(hash, "$")); chain; chain = chain.next())
	{
		if(noArguments && !chain->arguments.empty() && !chain->arguments[0].value)
			continue;

		if(chain->scope->ownerType != type)
			continue;

		if(!ContainsSameOverload(functions, *chain))
			functions.push_back(*chain);
	}

	if(typeGenericClassProto)
	{
		// Look for a member function in a generic class base and instantiate them
		unsigned hash = NULLC::StringHashContinue(typeGenericClassProto->nameHash, "::");

		InplaceStr functionName = GetTypeConstructorName(typeGenericClassProto);

		hash = NULLC::StringHashContinue(hash, functionName.begin, functionName.end);

		for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, NULLC::StringHashContinue(hash, "$")); chain; chain = chain.next())
		{
			if(noArguments && !chain->arguments.empty() && !chain->arguments[0].value)
				continue;

			if(!ContainsSameOverload(functions, *chain))
				functions.push_back(*chain);
		}
	}

	return !functions.empty();
}